

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>
rectangleFromVertices(Vector3 *pA,Vector3 *pB,Vector3 *pC)

{
  Vector3 *in_RCX;
  Vector3 local_68;
  Vector3 local_5c;
  Vector3 local_50;
  Vector3 local_44;
  Vector3 local_38;
  undefined1 local_29;
  Vector3 *pC_local;
  Vector3 *pB_local;
  Vector3 *pA_local;
  __single_object *rect;
  
  local_29 = 0;
  pC_local = pC;
  pB_local = pB;
  pA_local = pA;
  pm::Vector3::operator-(&local_38,pC);
  pm::Vector3::operator-(&local_44,in_RCX);
  pm::Vector3::operator-(&local_5c,pC);
  pm::Vector3::operator-(&local_68,in_RCX);
  pm::cross((pm *)&local_50,&local_5c,&local_68);
  pm::Vector3::normalize(&local_50);
  std::make_unique<pm::Rectangle,pm::Vector3_const&,pm::Vector3,pm::Vector3,pm::Vector3&>
            (pA,pB,&local_38,&local_44);
  return (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)
         (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)pA;
}

Assistant:

std::unique_ptr<pm::Rectangle> rectangleFromVertices(const pm::Vector3 pA, const pm::Vector3 pB, const pm::Vector3 pC)
{
	auto rect = std::make_unique<pm::Rectangle>(pA, pB - pA, pC - pA, cross(pB - pA, pC - pA).normalize());
	return rect;
}